

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatfile_tests.cpp
# Opt level: O2

void __thiscall flatfile_tests::flatfile_open::test_method(flatfile_open *this)

{
  long lVar1;
  path dir;
  size_t sVar2;
  iterator in_R8;
  iterator pvVar3;
  iterator in_R9;
  iterator pvVar4;
  FlatFilePos FVar5;
  string *psVar6;
  string *psVar7;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  undefined4 in_stack_fffffffffffffc18;
  undefined4 in_stack_fffffffffffffc1c;
  check_type cVar9;
  undefined8 in_stack_fffffffffffffc28;
  undefined8 in_stack_fffffffffffffc30;
  uint uVar8;
  _List in_stack_fffffffffffffc38;
  char *local_390;
  char *local_388;
  assertion_result local_380;
  undefined1 *local_368;
  undefined1 *local_360;
  char *local_358;
  char *local_350;
  undefined1 *local_348;
  undefined1 *local_340;
  char *local_338;
  char *local_330;
  _Vector_base<std::byte,_std::allocator<std::byte>_> local_328;
  char *local_308;
  char *local_300;
  undefined1 *local_2f8;
  undefined1 *local_2f0;
  char *local_2e8;
  char *local_2e0;
  _Vector_base<std::byte,_std::allocator<std::byte>_> local_2d8;
  char *local_2b8;
  char *local_2b0;
  undefined1 *local_2a8;
  undefined1 *local_2a0;
  char *local_298;
  char *local_290;
  char *local_288;
  char *local_280;
  assertion_result local_278;
  char *local_260;
  undefined1 *local_258;
  undefined1 *local_250;
  char *local_248;
  char *local_240;
  _Vector_base<std::byte,_std::allocator<std::byte>_> local_238;
  _Vector_base<std::byte,_std::allocator<std::byte>_> local_218 [3];
  char *local_1c8;
  char *local_1c0;
  AutoFile local_1b8;
  undefined1 *local_198;
  undefined1 *local_190;
  char *local_188;
  char *local_180;
  undefined1 *local_178;
  undefined1 *local_170;
  char *local_168;
  char *local_160;
  _Vector_base<std::byte,_std::allocator<std::byte>_> local_158;
  _Vector_base<std::byte,_std::allocator<std::byte>_> local_138;
  string text;
  string line2;
  string line1;
  path local_c0;
  FlatFileSeq seq;
  path data_dir;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ArgsManager::GetDataDirBase
            ((path *)&data_dir.super_path,&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_args);
  std::filesystem::__cxx11::path::path(&local_c0,&data_dir.super_path);
  dir.super_path._M_pathname._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffc1c;
  dir.super_path._M_pathname._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffc18;
  dir.super_path._M_pathname._M_string_length = (size_type)_cVar9;
  dir.super_path._M_pathname.field_2._M_allocated_capacity = in_stack_fffffffffffffc28;
  dir.super_path._M_pathname.field_2._8_8_ = in_stack_fffffffffffffc30;
  dir.super_path._M_cmpts._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       in_stack_fffffffffffffc38._M_impl._M_t.
       super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
       ._M_t.
       super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
       .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl;
  FlatFileSeq::FlatFileSeq(&seq,dir,(char *)&local_c0,0xbaa2de);
  std::filesystem::__cxx11::path::~path(&local_c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&line1,
             "A purely peer-to-peer version of electronic cash would allow online payments to be sent directly from one party to another without going through a financial institution."
             ,(allocator<char> *)&line2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&line2,
             "Digital signatures provide part of the solution, but the main benefits are lost if a trusted third party is still required to prevent double-spending."
             ,(allocator<char> *)&text);
  sVar2 = GetSerializeSize<std::__cxx11::string>(&line1);
  local_1b8.m_file = (FILE *)0x0;
  text._M_dataplus._M_p = (pointer)FlatFileSeq::Open(&seq,(FlatFilePos *)&local_1b8,false);
  text._M_string_length = 0;
  text.field_2._M_allocated_capacity = 0;
  text.field_2._8_8_ = 0;
  local_138._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_138._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base(&local_138);
  Serialize<AutoFile,char>((AutoFile *)&text,&line1);
  AutoFile::~AutoFile((AutoFile *)&text);
  local_1b8.m_file = (FILE *)(sVar2 << 0x20);
  text._M_dataplus._M_p = (pointer)FlatFileSeq::Open(&seq,(FlatFilePos *)&local_1b8,true);
  text._M_string_length = 0;
  text.field_2._M_allocated_capacity = 0;
  text.field_2._8_8_ = 0;
  local_158._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_158._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_158._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base(&local_158);
  local_168 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/flatfile_tests.cpp"
  ;
  local_160 = "";
  local_178 = &boost::unit_test::basic_cstring<char_const>::null;
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x36;
  file.m_begin = (iterator)&local_168;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_178,msg);
  Serialize<AutoFile,char>((AutoFile *)&text,&line2);
  local_188 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/flatfile_tests.cpp"
  ;
  local_180 = "";
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x36;
  file_00.m_begin = (iterator)&local_188;
  msg_00.m_end = in_R9;
  msg_00.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_198,
             msg_00);
  local_278._0_8_ = local_278._0_8_ & 0xffffffffffffff00;
  local_278.m_message.px = (element_type *)0x0;
  local_278.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1b8.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((ulong)local_1b8.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                        _M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
  local_1b8.m_file = (FILE *)&PTR__lazy_ostream_011482f0;
  local_1b8.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = boost::unit_test::lazy_ostream::inst;
  local_1b8.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0xb66465;
  local_1c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/flatfile_tests.cpp"
  ;
  local_1c0 = "";
  pvVar3 = &DAT_00000001;
  pvVar4 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            (&local_278,(lazy_ostream *)&local_1b8,1,1,WARN,_cVar9,(size_t)&local_1c8,0x36);
  boost::detail::shared_count::~shared_count(&local_278.m_message.pn);
  AutoFile::~AutoFile((AutoFile *)&text);
  local_1b8.m_file = (FILE *)(sVar2 << 0x20);
  text._M_dataplus._M_p = (pointer)FlatFileSeq::Open(&seq,(FlatFilePos *)&local_1b8,false);
  text._M_string_length = 0;
  text.field_2._M_allocated_capacity = 0;
  text.field_2._8_8_ = 0;
  local_218[0]._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_218[0]._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_218[0]._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base(local_218);
  Serialize<AutoFile,char>((AutoFile *)&text,&line2);
  AutoFile::~AutoFile((AutoFile *)&text);
  text._M_dataplus._M_p = (pointer)&text.field_2;
  text._M_string_length = 0;
  text.field_2._M_allocated_capacity = text.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_278._0_8_ = (FlatFilePos)0x0;
  local_1b8.m_file = FlatFileSeq::Open(&seq,(FlatFilePos *)&local_278,true);
  local_1b8.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b8.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b8.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_238._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_238._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_238._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base(&local_238);
  local_278._0_8_ = &text;
  Wrapper<LimitedStringFormatter<256UL>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::Unserialize<AutoFile>
            ((Wrapper<LimitedStringFormatter<256UL>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              *)&local_278,&local_1b8);
  local_248 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/flatfile_tests.cpp"
  ;
  local_240 = "";
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  local_250 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x45;
  file_01.m_begin = (iterator)&local_248;
  msg_01.m_end = pvVar4;
  msg_01.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_258,
             msg_01);
  local_278.m_message.px = (element_type *)((ulong)local_278.m_message.px & 0xffffffffffffff00);
  local_278._0_8_ = &PTR__lazy_ostream_011480b0;
  local_278.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_260 = "";
  local_288 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/flatfile_tests.cpp"
  ;
  local_280 = "";
  pvVar3 = (iterator)0x2;
  FVar5 = (FlatFilePos)&text;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
            (&local_278,&local_288,0x45,1,2,&text,0xce26ba,&line1,"line1");
  local_278._0_8_ = &text;
  Wrapper<LimitedStringFormatter<256UL>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::Unserialize<AutoFile>
            ((Wrapper<LimitedStringFormatter<256UL>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              *)&local_278,&local_1b8);
  local_298 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/flatfile_tests.cpp"
  ;
  local_290 = "";
  local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x48;
  file_02.m_begin = (iterator)&local_298;
  msg_02.m_end = (iterator)FVar5;
  msg_02.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_2a8,
             msg_02);
  local_278.m_message.px = (element_type *)((ulong)local_278.m_message.px & 0xffffffffffffff00);
  local_278._0_8_ = &PTR__lazy_ostream_011480b0;
  local_278.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_260 = "";
  local_2b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/flatfile_tests.cpp"
  ;
  local_2b0 = "";
  pvVar3 = (iterator)0x2;
  psVar6 = &text;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
            (&local_278,&local_2b8,0x48,1,2,psVar6,0xce26ba,&line2,"line2");
  AutoFile::~AutoFile(&local_1b8);
  std::__cxx11::string::~string((string *)&text);
  uVar8 = (uint)sVar2;
  text._M_dataplus._M_p = (pointer)&text.field_2;
  text._M_string_length = 0;
  text.field_2._M_allocated_capacity = text.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_278._0_8_ = sVar2 << 0x20;
  local_1b8.m_file = FlatFileSeq::Open(&seq,(FlatFilePos *)&local_278,false);
  local_1b8.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b8.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b8.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2d8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base(&local_2d8);
  local_278._0_8_ = &text;
  Wrapper<LimitedStringFormatter<256UL>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::Unserialize<AutoFile>
            ((Wrapper<LimitedStringFormatter<256UL>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              *)&local_278,&local_1b8);
  local_2e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/flatfile_tests.cpp"
  ;
  local_2e0 = "";
  local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x51;
  file_03.m_begin = (iterator)&local_2e8;
  msg_03.m_end = (iterator)psVar6;
  msg_03.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_2f8,
             msg_03);
  local_278.m_message.px = (element_type *)((ulong)local_278.m_message.px & 0xffffffffffffff00);
  local_278._0_8_ = &PTR__lazy_ostream_011480b0;
  local_278.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_260 = "";
  local_308 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/flatfile_tests.cpp"
  ;
  local_300 = "";
  psVar6 = &line2;
  pvVar3 = (iterator)0x2;
  psVar7 = &text;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
            (&local_278,&local_308,0x51,1,2,psVar7,0xce26ba,psVar6,"line2");
  AutoFile::~AutoFile(&local_1b8);
  std::__cxx11::string::~string((string *)&text);
  text._M_dataplus._M_p = (pointer)&text.field_2;
  text._M_string_length = 0;
  text.field_2._M_allocated_capacity = text.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_278._4_4_ = uVar8;
  local_278._0_4_ = 1;
  local_1b8.m_file = FlatFileSeq::Open(&seq,(FlatFilePos *)&local_278,false);
  local_1b8.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b8.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b8.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_328._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_328._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_328._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base(&local_328);
  local_338 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/flatfile_tests.cpp"
  ;
  local_330 = "";
  local_348 = &boost::unit_test::basic_cstring<char_const>::null;
  local_340 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = &DAT_00000058;
  file_04.m_begin = (iterator)&local_338;
  msg_04.m_end = (iterator)psVar7;
  msg_04.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_348,
             msg_04);
  local_278._0_8_ = &text;
  Wrapper<LimitedStringFormatter<256UL>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::Unserialize<AutoFile>
            ((Wrapper<LimitedStringFormatter<256UL>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              *)&local_278,&local_1b8);
  local_358 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/flatfile_tests.cpp"
  ;
  local_350 = "";
  local_368 = &boost::unit_test::basic_cstring<char_const>::null;
  local_360 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = &DAT_00000058;
  file_05.m_begin = (iterator)&local_358;
  msg_05.m_end = (iterator)psVar7;
  msg_05.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_368,
             msg_05);
  local_380.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x0;
  local_380.m_message.px = (element_type *)0x0;
  local_380.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_278.m_message.px = (element_type *)((ulong)local_278.m_message.px & 0xffffffffffffff00);
  local_278._0_8_ = &PTR__lazy_ostream_011482f0;
  local_278.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_260 = "exception std::ios_base::failure expected but not raised";
  local_390 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/flatfile_tests.cpp"
  ;
  local_388 = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_380,(lazy_ostream *)&local_278,1,1,WARN,(check_type)psVar6,(size_t)&local_390,
             0x58);
  boost::detail::shared_count::~shared_count(&local_380.m_message.pn);
  AutoFile::~AutoFile(&local_1b8);
  std::__cxx11::string::~string((string *)&text);
  std::__cxx11::string::~string((string *)&line2);
  std::__cxx11::string::~string((string *)&line1);
  std::filesystem::__cxx11::path::~path((path *)&seq);
  std::filesystem::__cxx11::path::~path(&data_dir.super_path);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(flatfile_open)
{
    const auto data_dir = m_args.GetDataDirBase();
    FlatFileSeq seq(data_dir, "a", 16 * 1024);

    std::string line1("A purely peer-to-peer version of electronic cash would allow online "
                      "payments to be sent directly from one party to another without going "
                      "through a financial institution.");
    std::string line2("Digital signatures provide part of the solution, but the main benefits are "
                      "lost if a trusted third party is still required to prevent double-spending.");

    size_t pos1 = 0;
    size_t pos2 = pos1 + GetSerializeSize(line1);

    // Write first line to file.
    {
        AutoFile file{seq.Open(FlatFilePos(0, pos1))};
        file << LIMITED_STRING(line1, 256);
    }

    // Attempt to append to file opened in read-only mode.
    {
        AutoFile file{seq.Open(FlatFilePos(0, pos2), true)};
        BOOST_CHECK_THROW(file << LIMITED_STRING(line2, 256), std::ios_base::failure);
    }

    // Append second line to file.
    {
        AutoFile file{seq.Open(FlatFilePos(0, pos2))};
        file << LIMITED_STRING(line2, 256);
    }

    // Read text from file in read-only mode.
    {
        std::string text;
        AutoFile file{seq.Open(FlatFilePos(0, pos1), true)};

        file >> LIMITED_STRING(text, 256);
        BOOST_CHECK_EQUAL(text, line1);

        file >> LIMITED_STRING(text, 256);
        BOOST_CHECK_EQUAL(text, line2);
    }

    // Read text from file with position offset.
    {
        std::string text;
        AutoFile file{seq.Open(FlatFilePos(0, pos2))};

        file >> LIMITED_STRING(text, 256);
        BOOST_CHECK_EQUAL(text, line2);
    }

    // Ensure another file in the sequence has no data.
    {
        std::string text;
        AutoFile file{seq.Open(FlatFilePos(1, pos2))};
        BOOST_CHECK_THROW(file >> LIMITED_STRING(text, 256), std::ios_base::failure);
    }
}